

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_blob64(sqlite3_context *pCtx,void *z,sqlite3_uint64 n,_func_void_void_ptr *xDel)

{
  void *in_RCX;
  _func_void_void_ptr *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  sqlite3_context *unaff_retaddr;
  _func_void_void_ptr *in_stack_ffffffffffffffd8;
  
  if (in_RDX < (_func_void_void_ptr *)0x80000000) {
    setResultStrOrError(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
                        (u8)((ulong)in_RSI >> 0x18),in_RDX);
  }
  else {
    invokeValueDestructor(in_RCX,in_stack_ffffffffffffffd8,(sqlite3_context *)0x13e7cb);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_blob64(
  sqlite3_context *pCtx,
  const void *z,
  sqlite3_uint64 n,
  void (*xDel)(void *)
){
  assert( xDel!=SQLITE_DYNAMIC );
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(z, xDel, 0);
    return;
  }
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, 0, xDel);
  }
}